

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableObjectDisplay::RecyclableObjectDisplay
          (RecyclableObjectDisplay *this,ResolvedObject *resolvedObject,
          DBGPROP_ATTRIB_FLAGS defaultAttributes)

{
  Var pvVar1;
  Var pvVar2;
  
  (this->super_IDiagObjectModelDisplay)._vptr_IDiagObjectModelDisplay =
       (_func_int **)&PTR_Name_0137ee80;
  this->scriptContext = resolvedObject->scriptContext;
  pvVar1 = resolvedObject->obj;
  this->instance = pvVar1;
  pvVar2 = resolvedObject->originalObj;
  if (resolvedObject->originalObj == (Var)0x0) {
    pvVar2 = pvVar1;
  }
  this->originalInstance = pvVar2;
  this->name = resolvedObject->name;
  this->pObjAddress = resolvedObject->address;
  this->defaultAttributes = defaultAttributes;
  this->propertyId = resolvedObject->propId;
  return;
}

Assistant:

RecyclableObjectDisplay::RecyclableObjectDisplay(ResolvedObject* resolvedObject, DBGPROP_ATTRIB_FLAGS defaultAttributes)
        : scriptContext(resolvedObject->scriptContext),
          instance(resolvedObject->obj),
          originalInstance(resolvedObject->originalObj != nullptr ? resolvedObject->originalObj : resolvedObject->obj), // If we don't have it set it means originalInstance should point to object itself
          name(resolvedObject->name),
          pObjAddress(resolvedObject->address),
          defaultAttributes(defaultAttributes),
          propertyId(resolvedObject->propId)
    {
    }